

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_popup_begin(nk_context *ctx,nk_popup_type type,char *title,nk_flags flags,nk_rect rect)

{
  byte *pbVar1;
  float fVar2;
  float fVar3;
  nk_window *pnVar4;
  nk_size nVar5;
  nk_size nVar6;
  nk_handle nVar7;
  nk_size nVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  nk_hash nVar13;
  int iVar14;
  nk_page_element *ptr;
  nk_page_element *ptr_00;
  nk_panel *pnVar15;
  long lVar16;
  nk_rect r;
  float local_58;
  float fStack_54;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41ad,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41ae,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41af,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (pnVar4->layout != (nk_panel *)0x0) {
    if ((pnVar4->layout->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
        NK_PANEL_NONE) {
      __assert_fail("!(panel->type & NK_PANEL_SET_POPUP) && \"popups are not allowed to have popups\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x41b6,
                    "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                   );
    }
    if (*title == '\0') {
      lVar16 = 0;
    }
    else {
      lVar16 = 0;
      do {
        lVar9 = lVar16 + 1;
        lVar16 = lVar16 + 1;
      } while (title[lVar9] != '\0');
    }
    nVar13 = nk_murmur_hash(title,(int)lVar16,4);
    ptr = (nk_page_element *)(pnVar4->popup).win;
    if (ptr == (nk_page_element *)0x0) {
      ptr = nk_create_page_element(ctx);
      (ptr->data).tbl.seq = ctx->seq;
      (ptr->data).win.parent = pnVar4;
      (pnVar4->popup).win = (nk_window *)ptr;
      (pnVar4->popup).active = 0;
      (pnVar4->popup).type = NK_PANEL_POPUP;
    }
    if ((pnVar4->popup).name != nVar13) {
      if ((pnVar4->popup).active != 0) {
        return 0;
      }
      nk_zero(ptr,0x1d8);
      (pnVar4->popup).name = nVar13;
      (pnVar4->popup).active = 1;
      (pnVar4->popup).type = NK_PANEL_POPUP;
    }
    ctx->current = (nk_window *)ptr;
    fVar2 = (pnVar4->layout->clip).x;
    local_58 = rect.x;
    fStack_54 = rect.y;
    fVar3 = (pnVar4->layout->clip).y;
    (ptr->data).win.parent = pnVar4;
    (ptr->data).pan.clip.w = fVar2 + local_58;
    (ptr->data).pan.clip.h = fStack_54 + fVar3;
    (ptr->data).tbl.keys[0x13] = (nk_hash)rect.w;
    (ptr->data).tbl.keys[0x14] = (nk_hash)rect.h;
    (ptr->data).tbl.seq = ctx->seq;
    ptr_00 = nk_create_page_element(ctx);
    nk_zero(ptr_00,0x200);
    (ptr->data).win.layout = (nk_panel *)ptr_00;
    (ptr->data).tbl.keys[0x10] = (uint)(type == NK_POPUP_DYNAMIC) << 0xb | flags | 1;
    fVar2 = (pnVar4->buffer).clip.x;
    fVar3 = (pnVar4->buffer).clip.y;
    fVar10 = (pnVar4->buffer).clip.w;
    fVar11 = (pnVar4->buffer).clip.h;
    iVar14 = (pnVar4->buffer).use_clipping;
    uVar12 = *(undefined4 *)&(pnVar4->buffer).field_0x1c;
    nVar7 = (pnVar4->buffer).userdata;
    nVar5 = (pnVar4->buffer).begin;
    nVar6 = (pnVar4->buffer).end;
    nVar8 = (pnVar4->buffer).last;
    (ptr->data).win.buffer.base = (pnVar4->buffer).base;
    *(float *)((long)&ptr->data + 0x70) = fVar2;
    *(float *)((long)&ptr->data + 0x74) = fVar3;
    *(float *)((long)&ptr->data + 0x78) = fVar10;
    *(float *)((long)&ptr->data + 0x7c) = fVar11;
    *(int *)((long)&ptr->data + 0x80) = iVar14;
    *(undefined4 *)((long)&ptr->data + 0x84) = uVar12;
    (ptr->data).win.buffer.userdata = nVar7;
    (ptr->data).win.buffer.begin = nVar5;
    (ptr->data).win.buffer.end = nVar6;
    (ptr->data).win.buffer.last = nVar8;
    nVar5 = (pnVar4->buffer).end;
    nVar6 = (pnVar4->buffer).last;
    (pnVar4->popup).buf.begin = nVar5;
    (pnVar4->popup).buf.end = nVar5;
    (pnVar4->popup).buf.parent = nVar6;
    (pnVar4->popup).buf.last = nVar5;
    (pnVar4->popup).buf.active = 1;
    nVar5 = (ctx->memory).allocated;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&(ptr->data).win.buffer,r);
    iVar14 = nk_panel_begin(ctx,title,NK_PANEL_POPUP);
    pnVar15 = pnVar4->layout;
    if (iVar14 == 0) {
      for (; pnVar15 != (nk_panel *)0x0; pnVar15 = pnVar15->parent) {
        pbVar1 = (byte *)((long)&pnVar15->flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      iVar14 = 0;
      (pnVar4->popup).buf.active = 0;
      (pnVar4->popup).active = 0;
      (ctx->memory).allocated = nVar5;
      ctx->current = pnVar4;
      nk_free_page_element(ctx,(nk_page_element *)(ptr->data).win.layout);
      (ptr->data).win.layout = (nk_panel *)0x0;
    }
    else {
      for (; pnVar15 != (nk_panel *)0x0; pnVar15 = pnVar15->parent) {
        pnVar15->flags = pnVar15->flags & 0xfffeefff | 0x1000;
      }
      (pnVar4->popup).active = 1;
      pnVar15 = (ptr->data).win.layout;
      pnVar15->offset_x = (nk_uint *)((long)&ptr->data + 0x5c);
      pnVar15->offset_y = (nk_uint *)((long)&ptr->data + 0x60);
      pnVar15->parent = pnVar4->layout;
      iVar14 = 1;
    }
    return iVar14;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x41b0,
                "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
               );
}

Assistant:

NK_API int
nk_popup_begin(struct nk_context *ctx, enum nk_popup_type type,
    const char *title, nk_flags flags, struct nk_rect rect)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;

    int title_len;
    nk_hash title_hash;
    nk_size allocated;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP) && "popups are not allowed to have popups");
    (void)panel;
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_POPUP);

    popup = win->popup.win;
    if (!popup) {
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.active = 0;
        win->popup.type = NK_PANEL_POPUP;
    }

    /* make sure we have correct popup */
    if (win->popup.name != title_hash) {
        if (!win->popup.active) {
            nk_zero(popup, sizeof(*popup));
            win->popup.name = title_hash;
            win->popup.active = 1;
            win->popup.type = NK_PANEL_POPUP;
        } else return 0;
    }

    /* popup position is local to window */
    ctx->current = popup;
    rect.x += win->layout->clip.x;
    rect.y += win->layout->clip.y;

    /* setup popup data */
    popup->parent = win;
    popup->bounds = rect;
    popup->seq = ctx->seq;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    if (type == NK_POPUP_DYNAMIC)
        popup->flags |= NK_WINDOW_DYNAMIC;

    popup->buffer = win->buffer;
    nk_start_popup(ctx, win);
    allocated = ctx->memory.allocated;
    nk_push_scissor(&popup->buffer, nk_null_rect);

    if (nk_panel_begin(ctx, title, NK_PANEL_POPUP)) {
        /* popup is running therefore invalidate parent panels */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_ROM;
            root->flags &= ~(nk_flags)NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.active = 1;
        popup->layout->offset_x = &popup->scrollbar.x;
        popup->layout->offset_y = &popup->scrollbar.y;
        popup->layout->parent = win->layout;
        return 1;
    } else {
        /* popup was closed/is invalid so cleanup */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.buf.active = 0;
        win->popup.active = 0;
        ctx->memory.allocated = allocated;
        ctx->current = win;
        nk_free_panel(ctx, popup->layout);
        popup->layout = 0;
        return 0;
    }
}